

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::HasGoogleTestFlagPrefix(char *str)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = SkipPrefix("--",&local_10);
  if (bVar1) {
LAB_00161c6d:
    bVar1 = SkipPrefix("gtest_internal_",&local_10);
    if (!bVar1) {
      bVar1 = SkipPrefix("gtest_",&local_10);
      bVar2 = true;
      if (!bVar1) {
        bVar2 = SkipPrefix("gtest-",&local_10);
      }
      goto LAB_00161cb0;
    }
  }
  else {
    bVar1 = SkipPrefix("-",&local_10);
    if (bVar1) goto LAB_00161c6d;
    bVar1 = SkipPrefix("/",&local_10);
    if (bVar1) goto LAB_00161c6d;
  }
  bVar2 = false;
LAB_00161cb0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool HasGoogleTestFlagPrefix(const char* str) {
  return (SkipPrefix("--", &str) ||
          SkipPrefix("-", &str) ||
          SkipPrefix("/", &str)) &&
         !SkipPrefix(GTEST_FLAG_PREFIX_ "internal_", &str) &&
         (SkipPrefix(GTEST_FLAG_PREFIX_, &str) ||
          SkipPrefix(GTEST_FLAG_PREFIX_DASH_, &str));
}